

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_adefda::HandleInsertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool *__return_storage_ptr__;
  string *psVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  cmMakefile *pcVar6;
  cmList *pcVar7;
  out_of_range *e;
  string local_108;
  string_view local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  cmList local_c0;
  undefined1 local_a8 [8];
  optional<cmList> list;
  int local_64;
  const_reference pvStack_60;
  int index;
  string *listName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar4 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command INSERT requires at least three arguments.",&local_41
              );
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvStack_60 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,1);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    bVar3 = GetIndexArg(pvVar5,&local_64,pcVar6);
    pcVar2 = local_20;
    psVar1 = pvStack_60;
    if (bVar3) {
      pcVar6 = cmExecutionStatus::GetMakefile(local_20);
      GetList((optional<cmList> *)local_a8,psVar1,pcVar6);
      bVar3 = std::optional::operator_cast_to_bool((optional *)local_a8);
      if (!bVar3) {
        memset(&local_c0,0,0x18);
        cmList::cmList(&local_c0);
        std::optional<cmList>::operator=((optional<cmList> *)local_a8,&local_c0);
        cmList::~cmList(&local_c0);
      }
      pcVar7 = std::optional<cmList>::operator->((optional<cmList> *)local_a8);
      local_d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator+(&local_d0,3);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
      cmList::
      insert_items<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (pcVar7,(long)local_64,local_c8,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_d8,No,Yes);
      pcVar6 = cmExecutionStatus::GetMakefile(local_20);
      psVar1 = pvStack_60;
      pcVar7 = std::optional<cmList>::operator->((optional<cmList> *)local_a8);
      cmList::to_string_abi_cxx11_(&local_108,pcVar7);
      local_e8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
      cmMakefile::AddDefinition(pcVar6,psVar1,local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      args_local._7_1_ = 1;
      std::optional<cmList>::~optional((optional<cmList> *)local_a8);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      __return_storage_ptr__ =
           &list.super__Optional_base<cmList,_false,_false>._M_payload.
            super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>
            ._M_engaged;
      cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                ((string *)__return_storage_ptr__,(char (*) [8])0x103d714,pvVar5,
                 (char (*) [22])0x1082972);
      cmExecutionStatus::SetError(pcVar2,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string
                ((string *)
                 &list.super__Optional_base<cmList,_false,_false>._M_payload.
                  super__Optional_payload<cmList,_true,_false,_false>.
                  super__Optional_payload_base<cmList>._M_engaged);
      args_local._7_1_ = 0;
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleInsertCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command INSERT requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];

  // expand the variable
  int index;
  if (!GetIndexArg(args[2], &index, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  auto list = GetList(listName, status.GetMakefile());
  if (!list) {
    list = cmList{};
  }

  try {
    list->insert_items(index, args.begin() + 3, args.end(),
                       cmList::ExpandElements::No, cmList::EmptyElements::Yes);
    status.GetMakefile().AddDefinition(listName, list->to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}